

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O2

int decompress8(DUMBFILE *f,char *data,int len,int it215,int stereo)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int extraout_EAX;
  ulong uVar5;
  ulong extraout_RAX;
  char cVar6;
  uint uVar7;
  char *pcVar8;
  char cVar9;
  char cVar10;
  uint uVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  readblock_crap local_58;
  
  local_58.sourceend = (uchar *)0x0;
  local_58.rembits = 0;
  local_58._28_4_ = 0;
  local_58.sourcepos = (uchar *)0x0;
  pcVar8 = data;
  iVar1 = 0;
  if (0 < len) {
    iVar1 = len;
  }
  while (iVar1 != 0) {
    *pcVar8 = '\0';
    pcVar8 = pcVar8 + (stereo + 1);
    iVar1 = iVar1 + -1;
  }
  uVar5 = (ulong)(uint)stereo;
  do {
    local_58.sourcebuf = (uchar *)0x0;
    iVar1 = (int)uVar5;
    if ((len < 1) || (iVar1 = readblock(f,&local_58), iVar1 != 0)) {
      return iVar1;
    }
    uVar2 = 0x8000;
    if ((uint)len < 0x8000) {
      uVar2 = len;
    }
    len = len - uVar2;
    uVar13 = 9;
    cVar9 = '\0';
    cVar10 = '\0';
    for (uVar3 = 0; uVar3 != uVar2; uVar3 = uVar3 + 1) {
      while( true ) {
        while( true ) {
          while( true ) {
            bVar12 = (byte)uVar13;
            uVar14 = uVar13 & 0xff;
            uVar4 = readbits(uVar14,&local_58);
            if (6 < bVar12) break;
            if ((uVar4 & 0xffff) != 1 << (bVar12 - 1 & 0x1f)) goto LAB_0064b87f;
            iVar1 = readbits(3,&local_58);
            uVar13 = iVar1 + (uint)(uVar14 <= (iVar1 + 1U & 0xffff)) + 1;
          }
          if (bVar12 < 9) break;
          if (bVar12 != 9) {
            free(local_58.sourcebuf);
            return extraout_EAX;
          }
          if ((uVar4 >> 8 & 1) == 0) {
            uVar7 = uVar4;
            uVar14 = 9;
            goto LAB_0064b894;
          }
          uVar13 = uVar4 + 1;
        }
        uVar7 = uVar4 & 0xffff;
        uVar11 = (0xffU >> (9 - bVar12 & 0x1f)) + 0xfc & 0xff;
        if ((uVar7 <= uVar11) || (uVar11 + 8 < uVar7)) break;
        uVar13 = (uint)(uVar14 <= (uVar4 - uVar11 & 0xffff)) + (uVar4 - uVar11);
      }
      uVar14 = 8;
      if (bVar12 == 7) {
LAB_0064b87f:
        uVar7 = (int)(char)(uVar4 << (8 - bVar12 & 0x1f)) >> (8 - bVar12 & 0x1f);
        uVar14 = uVar13;
      }
LAB_0064b894:
      uVar13 = uVar14;
      cVar9 = cVar9 + (char)uVar7;
      cVar10 = cVar10 + cVar9;
      cVar6 = cVar10;
      if (it215 == 0) {
        cVar6 = cVar9;
      }
      *data = cVar6;
      data = data + (ulong)(uint)stereo + 1;
    }
    free(local_58.sourcebuf);
    uVar5 = extraout_RAX;
  } while( true );
}

Assistant:

static int decompress8(DUMBFILE *f, signed char *data, int len, int it215, int stereo)
{
	int blocklen, blockpos;
	byte bitwidth;
	word val;
	char d1, d2;
	readblock_crap crap;

	memset(&crap, 0, sizeof(crap));

	for (blocklen = 0, blockpos = 0; blocklen < len; blocklen++, blockpos += 1 + stereo)
		data[ blockpos ] = 0;

	while (len > 0) {
		//Read a block of compressed data:
		if (readblock(f, &crap))
			return -1;
		//Set up a few variables
		blocklen = (len < 0x8000) ? len : 0x8000; //Max block length is 0x8000 bytes
		blockpos = 0;
		bitwidth = 9;
		d1 = d2 = 0;
		//Start the decompression:
		while (blockpos < blocklen) {
			//Read a value:
			val = (word)readbits(bitwidth, &crap);
			//Check for bit width change:

			if (bitwidth < 7) { //Method 1:
				if (val == (1 << (bitwidth - 1))) {
					val = (word)readbits(3, &crap) + 1;
					bitwidth = (val < bitwidth) ? val : val + 1;
					continue;
				}
			}
			else if (bitwidth < 9) { //Method 2
				byte border = (0xFF >> (9 - bitwidth)) - 4;

				if (val > border && val <= (border + 8)) {
					val -= border;
					bitwidth = (val < bitwidth) ? val : val + 1;
					continue;
				}
			}
			else if (bitwidth == 9) { //Method 3
				if (val & 0x100) {
					bitwidth = (val + 1) & 0xFF;
					continue;
				}
			}
			else { //Illegal width, abort ?
				freeblock(&crap);
				return -1;
			}

			//Expand the value to signed byte:
			{
				char v; //The sample value:
				if (bitwidth < 8) {
					byte shift = 8 - bitwidth;
					v = (val << shift);
					v >>= shift;
				}
				else
					v = (char)val;

				//And integrate the sample value
				//(It always has to end with integration doesn't it ? ;-)
				d1 += v;
				d2 += d1;
			}

			//Store !
			/* Version 2.15 was an unofficial version with hacked compression
			 * code. Yay, better compression :D
			 */
			*data++ = it215 ? d2 : d1;
			data += stereo;
			len--;
			blockpos++;
		}
		freeblock(&crap);
	}
	return 0;
}